

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsCompMesh.cpp
# Opt level: O2

void __thiscall TPZMultiphysicsCompMesh::CleanElementsConnects(TPZMultiphysicsCompMesh *this)

{
  TPZAdmChunkVector<TPZCompEl_*,_10> *this_00;
  TPZCompEl *pTVar1;
  TPZCompEl **ppTVar2;
  TPZConnect *this_01;
  TPZAdmChunkVector<TPZConnect,_10> *this_02;
  long lVar3;
  long lVar4;
  
  lVar3 = (this->super_TPZCompMesh).fElementVec.super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  this_00 = &(this->super_TPZCompMesh).fElementVec;
  lVar4 = 0;
  if (lVar3 < 1) {
    lVar3 = lVar4;
  }
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    pTVar1 = TPZCompMesh::Element(&this->super_TPZCompMesh,lVar4);
    if (pTVar1 != (TPZCompEl *)0x0) {
      (**(code **)(*(long *)pTVar1 + 8))(pTVar1);
      ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&this_00->super_TPZChunkVector<TPZCompEl_*,_10>,lVar4);
      *ppTVar2 = (TPZCompEl *)0x0;
    }
  }
  lVar4 = 0;
  TPZAdmChunkVector<TPZCompEl_*,_10>::Resize(this_00,0);
  lVar3 = (this->super_TPZCompMesh).fConnectVec.super_TPZChunkVector<TPZConnect,_10>.fNElements;
  this_02 = &(this->super_TPZCompMesh).fConnectVec;
  if (lVar3 < 1) {
    lVar3 = lVar4;
  }
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    this_01 = TPZChunkVector<TPZConnect,_10>::operator[]
                        (&this_02->super_TPZChunkVector<TPZConnect,_10>,lVar4);
    TPZConnect::RemoveDepend(this_01);
  }
  TPZAdmChunkVector<TPZConnect,_10>::Resize(this_02,0);
  return;
}

Assistant:

void TPZMultiphysicsCompMesh::CleanElementsConnects()
{
    int64_t nel = NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = Element(el);
        if(cel)
        {
            delete cel;
            fElementVec[el] = 0;
        }
    }
    fElementVec.Resize(0);
    nel = fConnectVec.NElements();
    for (int64_t el=0; el<nel; el++) {
        fConnectVec[el].RemoveDepend();
    }
    fConnectVec.Resize(0);
}